

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O3

void av1_build_quantizer(aom_bit_depth_t bit_depth,int y_dc_delta_q,int u_dc_delta_q,
                        int u_ac_delta_q,int v_dc_delta_q,int v_ac_delta_q,QUANTS *quants,
                        Dequants *deq,int sharpness)

{
  int iVar1;
  bool bVar2;
  int16_t iVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  int16_t *piVar7;
  long lVar8;
  int16_t *piVar9;
  uint uVar10;
  int qindex;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  
  iVar5 = sharpness * -0x10 + 0x70;
  iVar5 = (int)((ulong)((long)iVar5 * 0x6db6db6d) >> 0x20) - iVar5;
  iVar5 = ((iVar5 >> 2) - (iVar5 >> 0x1f)) + 0x40;
  piVar9 = quants->v_round[0] + 2;
  piVar7 = deq->v_dequant_QTX[0] + 2;
  lVar13 = 0;
  do {
    qindex = (int)lVar13;
    iVar3 = av1_dc_quant_QTX(qindex,0,bit_depth);
    if (bit_depth == AOM_BITS_12) {
      bVar15 = SBORROW4((int)iVar3,0x940);
      bVar14 = iVar3 + -0x940 < 0;
LAB_0019a787:
      iVar6 = (uint)(bVar15 != bVar14) * 4 + 0x50;
      if (lVar13 == 0) {
        iVar6 = 0x40;
      }
    }
    else {
      if (bit_depth == AOM_BITS_10) {
        bVar15 = SBORROW4((int)iVar3,0x250);
        bVar14 = iVar3 + -0x250 < 0;
        goto LAB_0019a787;
      }
      iVar6 = -1;
      if (bit_depth == AOM_BITS_8) {
        bVar15 = SBORROW4((int)iVar3,0x94);
        bVar14 = iVar3 + -0x94 < 0;
        goto LAB_0019a787;
      }
    }
    bVar14 = lVar13 != 0;
    iVar12 = (uint)(lVar13 == 0) * 0x10 + 0x30;
    iVar11 = 0x40;
    if (bVar14 && sharpness != 0) {
      iVar11 = iVar5;
    }
    lVar8 = 0;
    bVar15 = true;
    do {
      bVar2 = bVar15;
      if (bVar14 && sharpness != 0) {
        iVar12 = iVar5;
      }
      if (bVar2) {
        sVar4 = av1_dc_quant_QTX(qindex,y_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,0,bit_depth);
      }
      uVar10 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      quants->y_quant[lVar13][lVar8] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar10) + 1;
      quants->y_quant_shift[lVar13][lVar8] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      quants->y_quant_fp[lVar13][lVar8] = (int16_t)(0x10000 / (long)(int)uVar10);
      quants->y_round_fp[lVar13][lVar8] = (int16_t)(iVar11 * uVar10 >> 7);
      quants->y_zbin[lVar13][lVar8] = (int16_t)(iVar6 * uVar10 + 0x40 >> 7);
      quants->y_round[lVar13][lVar8] = (int16_t)(iVar12 * uVar10 >> 7);
      deq->y_dequant_QTX[lVar13][lVar8] = sVar4;
      if (bVar2) {
        sVar4 = av1_dc_quant_QTX(qindex,u_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,u_ac_delta_q,bit_depth);
      }
      uVar10 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      quants->u_quant[lVar13][lVar8] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar10) + 1;
      quants->u_quant_shift[lVar13][lVar8] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      quants->u_quant_fp[lVar13][lVar8] = (int16_t)(0x10000 / (long)(int)uVar10);
      quants->u_round_fp[lVar13][lVar8] = (int16_t)(iVar11 * uVar10 >> 7);
      quants->u_zbin[lVar13][lVar8] = (int16_t)(iVar6 * uVar10 + 0x40 >> 7);
      quants->u_round[lVar13][lVar8] = (int16_t)(iVar12 * uVar10 >> 7);
      deq->u_dequant_QTX[lVar13][lVar8] = sVar4;
      if (bVar2) {
        sVar4 = av1_dc_quant_QTX(qindex,v_dc_delta_q,bit_depth);
      }
      else {
        sVar4 = av1_ac_quant_QTX(qindex,v_ac_delta_q,bit_depth);
      }
      uVar10 = (uint)sVar4;
      iVar1 = 0x1f;
      if (uVar10 != 0) {
        for (; uVar10 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      quants->v_quant[lVar13][lVar8] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar10) + 1;
      quants->v_quant_shift[lVar13][lVar8] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      quants->v_quant_fp[lVar13][lVar8] = (int16_t)(0x10000 / (long)(int)uVar10);
      quants->v_round_fp[lVar13][lVar8] = (int16_t)(iVar11 * uVar10 >> 7);
      quants->v_zbin[lVar13][lVar8] = (int16_t)(iVar6 * uVar10 + 0x40 >> 7);
      quants->v_round[lVar13][lVar8] = (int16_t)(iVar12 * uVar10 >> 7);
      deq->v_dequant_QTX[lVar13][lVar8] = sVar4;
      lVar8 = 1;
      bVar15 = false;
    } while (bVar2);
    lVar8 = 0;
    do {
      piVar9[lVar8 + -0x8800] = quants->y_quant[lVar13][1];
      piVar9[lVar8 + -0x6800] = quants->y_quant_fp[lVar13][1];
      piVar9[lVar8 + -0x5000] = quants->y_round_fp[lVar13][1];
      piVar9[lVar8 + -0x8000] = quants->y_quant_shift[lVar13][1];
      piVar9[lVar8 + -0x7800] = quants->y_zbin[lVar13][1];
      piVar9[lVar8 + -0x7000] = quants->y_round[lVar13][1];
      piVar7[lVar8 + -0x1000] = deq->y_dequant_QTX[lVar13][1];
      piVar9[lVar8 + -0x3800] = quants->u_quant[lVar13][1];
      piVar9[lVar8 + -0x6000] = quants->u_quant_fp[lVar13][1];
      piVar9[lVar8 + -0x4800] = quants->u_round_fp[lVar13][1];
      piVar9[lVar8 + -0x2800] = quants->u_quant_shift[lVar13][1];
      piVar9[lVar8 + -0x1800] = quants->u_zbin[lVar13][1];
      piVar9[lVar8 + -0x800] = quants->u_round[lVar13][1];
      piVar7[lVar8 + -0x800] = deq->u_dequant_QTX[lVar13][1];
      piVar9[lVar8 + -0x3000] = quants->v_quant[lVar13][1];
      piVar9[lVar8 + -0x5800] = quants->v_quant_fp[lVar13][1];
      piVar9[lVar8 + -0x4000] = quants->v_round_fp[lVar13][1];
      piVar9[lVar8 + -0x2000] = quants->v_quant_shift[lVar13][1];
      piVar9[lVar8 + -0x1000] = quants->v_zbin[lVar13][1];
      piVar9[lVar8] = quants->v_round[lVar13][1];
      piVar7[lVar8] = deq->v_dequant_QTX[lVar13][1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    lVar13 = lVar13 + 1;
    piVar9 = piVar9 + 8;
    piVar7 = piVar7 + 8;
    if (lVar13 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void av1_build_quantizer(aom_bit_depth_t bit_depth, int y_dc_delta_q,
                         int u_dc_delta_q, int u_ac_delta_q, int v_dc_delta_q,
                         int v_ac_delta_q, QUANTS *const quants,
                         Dequants *const deq, int sharpness) {
  int i, q, quant_QTX;
  const int sharpness_adjustment = 16 * (7 - sharpness) / 7;

  for (q = 0; q < QINDEX_RANGE; q++) {
    const int qzbin_factor = get_qzbin_factor(q, bit_depth);
    int qrounding_factor = q == 0 ? 64 : 48;

    for (i = 0; i < 2; ++i) {
      int qrounding_factor_fp = 64;

      if (sharpness != 0 && q != 0) {
        qrounding_factor = 64 - sharpness_adjustment;
        qrounding_factor_fp = 64 - sharpness_adjustment;
      }

      // y quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, y_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, 0, bit_depth);
      invert_quant(&quants->y_quant[q][i], &quants->y_quant_shift[q][i],
                   quant_QTX);
      quants->y_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->y_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->y_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->y_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->y_dequant_QTX[q][i] = quant_QTX;

      // u quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, u_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, u_ac_delta_q, bit_depth);
      invert_quant(&quants->u_quant[q][i], &quants->u_quant_shift[q][i],
                   quant_QTX);
      quants->u_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->u_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->u_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->u_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->u_dequant_QTX[q][i] = quant_QTX;

      // v quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, v_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, v_ac_delta_q, bit_depth);
      invert_quant(&quants->v_quant[q][i], &quants->v_quant_shift[q][i],
                   quant_QTX);
      quants->v_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->v_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->v_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->v_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->v_dequant_QTX[q][i] = quant_QTX;
    }

    for (i = 2; i < 8; i++) {  // 8: SIMD width
      quants->y_quant[q][i] = quants->y_quant[q][1];
      quants->y_quant_fp[q][i] = quants->y_quant_fp[q][1];
      quants->y_round_fp[q][i] = quants->y_round_fp[q][1];
      quants->y_quant_shift[q][i] = quants->y_quant_shift[q][1];
      quants->y_zbin[q][i] = quants->y_zbin[q][1];
      quants->y_round[q][i] = quants->y_round[q][1];
      deq->y_dequant_QTX[q][i] = deq->y_dequant_QTX[q][1];

      quants->u_quant[q][i] = quants->u_quant[q][1];
      quants->u_quant_fp[q][i] = quants->u_quant_fp[q][1];
      quants->u_round_fp[q][i] = quants->u_round_fp[q][1];
      quants->u_quant_shift[q][i] = quants->u_quant_shift[q][1];
      quants->u_zbin[q][i] = quants->u_zbin[q][1];
      quants->u_round[q][i] = quants->u_round[q][1];
      deq->u_dequant_QTX[q][i] = deq->u_dequant_QTX[q][1];

      quants->v_quant[q][i] = quants->v_quant[q][1];
      quants->v_quant_fp[q][i] = quants->v_quant_fp[q][1];
      quants->v_round_fp[q][i] = quants->v_round_fp[q][1];
      quants->v_quant_shift[q][i] = quants->v_quant_shift[q][1];
      quants->v_zbin[q][i] = quants->v_zbin[q][1];
      quants->v_round[q][i] = quants->v_round[q][1];
      deq->v_dequant_QTX[q][i] = deq->v_dequant_QTX[q][1];
    }
  }
}